

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SystemTools.cxx
# Opt level: O1

bool kwssys::SystemTools::FileHasSignature(char *filename,char *signature,long offset)

{
  int iVar1;
  size_t sVar2;
  FILE *__stream;
  char *__s1;
  size_t sVar3;
  bool bVar4;
  char *local_50 [2];
  char local_40 [16];
  
  if (signature != (char *)0x0 && filename != (char *)0x0) {
    local_50[0] = local_40;
    sVar2 = strlen(filename);
    std::__cxx11::string::_M_construct<char_const*>((string *)local_50,filename,filename + sVar2);
    __stream = fopen(local_50[0],"rb");
    if (local_50[0] != local_40) {
      operator_delete(local_50[0]);
    }
    if (__stream != (FILE *)0x0) {
      bVar4 = false;
      fseek(__stream,offset,0);
      sVar2 = strlen(signature);
      __s1 = (char *)operator_new__(sVar2);
      sVar3 = fread(__s1,1,sVar2,__stream);
      if (sVar3 == sVar2) {
        iVar1 = strncmp(__s1,signature,sVar2);
        bVar4 = iVar1 == 0;
      }
      operator_delete__(__s1);
      fclose(__stream);
      return bVar4;
    }
  }
  return false;
}

Assistant:

bool SystemTools::FileHasSignature(const char* filename, const char* signature,
                                   long offset)
{
  if (!filename || !signature) {
    return false;
  }

  FILE* fp = Fopen(filename, "rb");
  if (!fp) {
    return false;
  }

  fseek(fp, offset, SEEK_SET);

  bool res = false;
  size_t signature_len = strlen(signature);
  char* buffer = new char[signature_len];

  if (fread(buffer, 1, signature_len, fp) == signature_len) {
    res = (!strncmp(buffer, signature, signature_len) ? true : false);
  }

  delete[] buffer;

  fclose(fp);
  return res;
}